

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_game.cc
# Opt level: O0

unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall hanabi_learning_env::HanabiGame::Parameters_abi_cxx11_(HanabiGame *this)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  HanabiGame *in_RSI;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffbb0;
  key_equal *in_stack_fffffffffffffbb8;
  hasher *in_stack_fffffffffffffbc0;
  size_type in_stack_fffffffffffffbc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd0;
  iterator in_stack_fffffffffffffbd8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffbe0;
  undefined1 ***pppuVar1;
  allocator_type *in_stack_fffffffffffffbf0;
  char (*in_stack_fffffffffffffbf8) [20];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffc00;
  string local_380 [32];
  char *local_360;
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [48];
  string local_288 [32];
  undefined1 **local_268;
  undefined8 *local_260 [8];
  undefined1 local_220 [64];
  undefined1 local_1e0 [64];
  undefined1 local_1a0 [64];
  undefined1 local_160 [64];
  undefined1 local_120 [64];
  undefined1 local_e0 [64];
  undefined1 local_a0 [64];
  undefined1 local_60 [64];
  undefined1 **local_20;
  undefined8 local_18;
  
  local_268 = (undefined1 **)local_260;
  std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffbf8 >> 0x20));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffffbe0,(char (*) [8])in_stack_fffffffffffffbd8,
             in_stack_fffffffffffffbd0);
  local_268 = (undefined1 **)local_220;
  NumColors(in_RSI);
  std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffbf8 >> 0x20));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffffbe0,(char (*) [7])in_stack_fffffffffffffbd8,
             in_stack_fffffffffffffbd0);
  local_268 = (undefined1 **)local_1e0;
  NumRanks(in_RSI);
  std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffbf8 >> 0x20));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffffbe0,(char (*) [6])in_stack_fffffffffffffbd8,
             in_stack_fffffffffffffbd0);
  local_268 = (undefined1 **)local_1a0;
  HandSize(in_RSI);
  std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffbf8 >> 0x20));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffffbe0,(char (*) [10])in_stack_fffffffffffffbd8,
             in_stack_fffffffffffffbd0);
  local_268 = (undefined1 **)local_160;
  MaxInformationTokens(in_RSI);
  std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffbf8 >> 0x20));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[23],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffffbe0,(char (*) [23])in_stack_fffffffffffffbd8,
             in_stack_fffffffffffffbd0);
  local_268 = (undefined1 **)local_120;
  MaxLifeTokens(in_RSI);
  std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffbf8 >> 0x20));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[16],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffffbe0,(char (*) [16])in_stack_fffffffffffffbd8,
             in_stack_fffffffffffffbd0);
  local_268 = (undefined1 **)local_e0;
  std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffbf8 >> 0x20));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffffbe0,(char (*) [5])in_stack_fffffffffffffbd8,
             in_stack_fffffffffffffbd0);
  local_268 = (undefined1 **)local_a0;
  local_360 = "false";
  if ((in_RSI->random_start_player_ & 1U) != 0) {
    local_360 = "true";
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[20],_const_char_*,_true>
            (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,(char **)in_stack_fffffffffffffbf0)
  ;
  local_268 = (undefined1 **)local_60;
  std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffbf8 >> 0x20));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[17],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffffbe0,(char (*) [17])in_stack_fffffffffffffbd8,
             in_stack_fffffffffffffbd0);
  local_20 = (undefined1 **)local_260;
  local_18 = 9;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x1411db);
  __l._M_len = (size_type)in_stack_fffffffffffffbe0;
  __l._M_array = in_stack_fffffffffffffbd8;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffbd0,__l,in_stack_fffffffffffffbc8,
                  in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbf0);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x141226);
  pppuVar1 = &local_20;
  do {
    pppuVar1 = pppuVar1 + -8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(in_stack_fffffffffffffbb0);
  } while (pppuVar1 != (undefined1 ***)local_260);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string(local_358);
  std::__cxx11::string::~string(local_338);
  std::__cxx11::string::~string(local_318);
  std::__cxx11::string::~string(local_2f8);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string(local_2b8);
  std::__cxx11::string::~string(local_288);
  return in_RDI;
}

Assistant:

std::unordered_map<std::string, std::string> HanabiGame::Parameters() const {
  return {{"players", std::to_string(num_players_)},
          {"colors", std::to_string(NumColors())},
          {"ranks", std::to_string(NumRanks())},
          {"hand_size", std::to_string(HandSize())},
          {"max_information_tokens", std::to_string(MaxInformationTokens())},
          {"max_life_tokens", std::to_string(MaxLifeTokens())},
          {"seed", std::to_string(seed_)},
          {"random_start_player", random_start_player_ ? "true" : "false"},
          {"observation_type", std::to_string(observation_type_)}};
}